

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

void slab_cache_check(slab_cache *cache)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  FILE *pFVar4;
  uint8_t order_00;
  rlist *prVar5;
  rlist *prVar6;
  intptr_t iVar7;
  ulong uVar8;
  slab_list *psStack_70;
  uint8_t order;
  slab_list *list;
  rlist *local_58;
  slab *slab;
  rlist *slabs;
  long lStack_40;
  _Bool dont_panic;
  size_t huge;
  size_t ordered;
  size_t used;
  size_t total;
  slab_cache *cache_local;
  
  used = 0;
  ordered = 0;
  huge = 0;
  lStack_40 = 0;
  bVar3 = true;
  for (local_58 = (cache->allocated).slabs.next; (slab_list *)local_58 != &cache->allocated;
      local_58 = local_58->next) {
    if (*(int *)&local_58[2].next != -0x113f0012) {
      fprintf(_stderr,"%s: incorrect slab magic, expected %d, got %d","slab_cache_check",0xeec0ffee,
              (ulong)*(uint *)&local_58[2].next);
      bVar3 = false;
    }
    if ((uint)*(byte *)((long)&local_58[2].next + 4) == cache->order_max + 1) {
      lStack_40 = (long)&(local_58[2].prev)->prev + lStack_40;
      ordered = (long)&(local_58[2].prev)->prev + ordered;
      prVar6 = local_58[2].prev;
    }
    else {
      prVar6 = local_58[2].prev;
      prVar5 = (rlist *)slab_order_size(cache,*(uint8_t *)((long)&local_58[2].next + 4));
      pFVar4 = _stderr;
      if (prVar6 != prVar5) {
        iVar7 = slab_order_size(cache,*(uint8_t *)((long)&local_58[2].next + 4));
        fprintf(pFVar4,"%s: incorrect slab size, expected %zu, got %zu","slab_cache_check",iVar7,
                local_58[2].prev);
        bVar3 = false;
      }
      prVar6 = (rlist *)slab_order_size(cache,cache->order_max);
    }
    used = (long)&prVar6->prev + used;
  }
  if (used != (cache->allocated).stats.total) {
    fprintf(_stderr,"%s: incorrect slab statistics, total %zu, factual %zu\n","slab_cache_check",
            (cache->allocated).stats.total,used);
    bVar3 = false;
  }
  for (psStack_70 = cache->orders; psStack_70 <= cache->orders + (int)(uint)cache->order_max;
      psStack_70 = psStack_70 + 1) {
    iVar7 = slab_order_size(cache,(uint8_t)((long)psStack_70 - (long)cache->orders >> 5));
    order_00 = (uint8_t)iVar7;
    huge = (psStack_70->stats).total + huge;
    ordered = (psStack_70->stats).used + ordered;
    uVar1 = (psStack_70->stats).total;
    uVar8 = slab_order_size(cache,order_00);
    pFVar4 = _stderr;
    if (uVar1 % uVar8 != 0) {
      sVar2 = (psStack_70->stats).total;
      iVar7 = slab_order_size(cache,order_00);
      fprintf(pFVar4,
              "%s: incorrect order statistics, the total %zu is not multiple of slab size %zu\n",
              "slab_cache_check",sVar2,iVar7);
      bVar3 = false;
    }
    uVar1 = (psStack_70->stats).used;
    uVar8 = slab_order_size(cache,order_00);
    pFVar4 = _stderr;
    if (uVar1 % uVar8 != 0) {
      sVar2 = (psStack_70->stats).used;
      iVar7 = slab_order_size(cache,order_00);
      fprintf(pFVar4,
              "%s: incorrect order statistics, the used %zu is not multiple of slab size %zu\n",
              "slab_cache_check",sVar2,iVar7);
      bVar3 = false;
    }
  }
  if (huge + lStack_40 != used) {
    fprintf(_stderr,"%s: incorrect totals, ordered %zu,  huge %zu, total %zu\n","slab_cache_check",
            huge,lStack_40,used);
    bVar3 = false;
  }
  if (ordered != (cache->allocated).stats.used) {
    fprintf(_stderr,"%s: incorrect used total, total %zu, sum %zu\n","slab_cache_check",
            (cache->allocated).stats.used,ordered);
    bVar3 = false;
  }
  if (bVar3) {
    return;
  }
  abort();
}

Assistant:

void
slab_cache_check(struct slab_cache *cache)
{
	size_t total = 0;
	size_t used = 0;
	size_t ordered = 0;
	size_t huge = 0;
	bool dont_panic = true;

	struct rlist *slabs = &cache->allocated.slabs;
	struct slab *slab;

	rlist_foreach_entry(slab, slabs, next_in_cache) {
		if (slab->magic != slab_magic) {
			fprintf(stderr, "%s: incorrect slab magic,"
				" expected %d, got %d", __func__,
				slab_magic, slab->magic);
			dont_panic = false;
		}
		if (slab->order == cache->order_max + 1) {
			huge += slab->size;
			used += slab->size;
			total += slab->size;
		} else {
			if ((intptr_t) slab->size !=
					slab_order_size(cache, slab->order)) {
				fprintf(stderr, "%s: incorrect slab size,"
					" expected %zu, got %zu", __func__,
					slab_order_size(cache, slab->order),
					slab->size);
				dont_panic = false;
			}
			/*
			 * The slab may have been reformatted
			 * and split into smaller slabs, don't
			 * trust slab->size.
			 */
			total += slab_order_size(cache, cache->order_max);
		}
	}

	if (total != cache->allocated.stats.total) {
		fprintf(stderr, "%s: incorrect slab statistics, total %zu,"
			" factual %zu\n", __func__,
			cache->allocated.stats.total,
			total);
		dont_panic = false;
	}
	struct slab_list *list;
	for (list = cache->orders;
	     list <= cache->orders + cache->order_max;
	     list++) {

		uint8_t order = slab_order_size(cache, list - cache->orders);
		ordered += list->stats.total;
		used += list->stats.used;

		if (list->stats.total % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" total %zu is not multiple of slab size %zu\n",
				__func__, list->stats.total,
				slab_order_size(cache, order));
			dont_panic = false;
		}
		if (list->stats.used % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" used %zu is not multiple of slab size %zu\n",
				__func__, list->stats.used,
				slab_order_size(cache, order));
			dont_panic = false;
		}
	}

	if (ordered + huge != total) {
		fprintf(stderr, "%s: incorrect totals, ordered %zu, "
			" huge %zu, total %zu\n", __func__,
			ordered, huge, total);
		dont_panic = false;
	}
	if (used != cache->allocated.stats.used) {
		fprintf(stderr, "%s: incorrect used total, "
			"total %zu, sum %zu\n", __func__,
			cache->allocated.stats.used,
			used);
		dont_panic = false;
	}
	if (dont_panic)
		return;
	abort();
}